

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psset.c
# Opt level: O3

void duckdb_je_psset_remove(psset_t *psset,hpdata_t *ps)

{
  hpdata_t *phVar1;
  hpdata_t *phVar2;
  hpdata_t *phVar3;
  
  ps->h_in_psset = false;
  psset_stats_remove(psset,ps);
  if (ps->h_in_psset_alloc_container == true) {
    psset_alloc_container_remove(psset,ps);
  }
  psset_maybe_remove_purge_list(psset,ps);
  if (ps->h_in_psset_hugify_container == true) {
    ps->h_in_psset_hugify_container = false;
    phVar3 = (psset->to_hugify).head.qlh_first;
    if (phVar3 == ps) {
      phVar3 = (phVar3->ql_link_hugify).qre_next;
      (psset->to_hugify).head.qlh_first = phVar3;
    }
    if (phVar3 == ps) {
      (psset->to_hugify).head.qlh_first = (hpdata_t *)0x0;
    }
    else {
      phVar3 = (ps->ql_link_hugify).qre_prev;
      phVar1 = (((ps->ql_link_hugify).qre_next)->ql_link_hugify).qre_prev;
      (phVar3->ql_link_hugify).qre_next = phVar1;
      phVar2 = (ps->ql_link_hugify).qre_next;
      (phVar2->ql_link_hugify).qre_prev = phVar3;
      (ps->ql_link_hugify).qre_prev = phVar1;
      (((phVar2->ql_link_hugify).qre_prev)->ql_link_hugify).qre_next = phVar2;
      (phVar1->ql_link_hugify).qre_next = ps;
    }
  }
  return;
}

Assistant:

void
psset_remove(psset_t *psset, hpdata_t *ps) {
	hpdata_in_psset_set(ps, false);

	psset_stats_remove(psset, ps);
	if (hpdata_in_psset_alloc_container_get(ps)) {
		psset_alloc_container_remove(psset, ps);
	}
	psset_maybe_remove_purge_list(psset, ps);
	if (hpdata_in_psset_hugify_container_get(ps)) {
		hpdata_in_psset_hugify_container_set(ps, false);
		hpdata_hugify_list_remove(&psset->to_hugify, ps);
	}
}